

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall
leveldb::MemTable::Add(MemTable *this,SequenceNumber s,ValueType type,Slice *key,Slice *value)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *p;
  char *buf;
  size_t encoded_len;
  size_t internal_key_size;
  size_t val_size;
  size_t key_size;
  Slice *value_local;
  Slice *key_local;
  SequenceNumber SStack_18;
  ValueType type_local;
  SequenceNumber s_local;
  MemTable *this_local;
  
  key_size = (size_t)value;
  value_local = key;
  key_local._4_4_ = type;
  SStack_18 = s;
  s_local = (SequenceNumber)this;
  val_size = Slice::size(key);
  internal_key_size = Slice::size((Slice *)key_size);
  encoded_len = val_size + 8;
  iVar1 = VarintLength(encoded_len);
  lVar2 = (long)iVar1 + encoded_len;
  iVar1 = VarintLength(internal_key_size);
  buf = (char *)(lVar2 + iVar1 + internal_key_size);
  p = Arena::Allocate(&this->arena_,(size_t)buf);
  pcVar3 = EncodeVarint32(p,(uint32_t)encoded_len);
  pcVar4 = Slice::data(value_local);
  memcpy(pcVar3,pcVar4,val_size);
  pcVar3 = pcVar3 + val_size;
  EncodeFixed64(pcVar3,SStack_18 << 8 | (ulong)key_local._4_4_);
  pcVar4 = EncodeVarint32(pcVar3 + 8,(uint32_t)internal_key_size);
  pcVar3 = Slice::data((Slice *)key_size);
  memcpy(pcVar4,pcVar3,internal_key_size);
  if (pcVar4 + (internal_key_size - (long)p) == buf) {
    SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert(&this->table_,&p);
    return;
  }
  __assert_fail("(p + val_size) - buf == encoded_len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/memtable.cc"
                ,0x70,
                "void leveldb::MemTable::Add(SequenceNumber, ValueType, const Slice &, const Slice &)"
               );
}

Assistant:

void MemTable::Add(SequenceNumber s, ValueType type,
                       const Slice &key,
                       const Slice &value) {
        // Format of an entry is concatenation of:
        //  key_size     : varint32 of internal_key.size()
        //  key bytes    : char[internal_key.size()]
        //  value_size   : varint32 of value.size()
        //  value bytes  : char[value.size()]
        size_t key_size = key.size();
        size_t val_size = value.size();
        size_t internal_key_size = key_size + 8;
        const size_t encoded_len =
                VarintLength(internal_key_size) + internal_key_size +
                VarintLength(val_size) + val_size;
        char *buf = arena_.Allocate(encoded_len);
        char *p = EncodeVarint32(buf, internal_key_size);
        memcpy(p, key.data(), key_size);
        p += key_size;
        EncodeFixed64(p, (s << 8) | type);
        p += 8;
        p = EncodeVarint32(p, val_size);
        memcpy(p, value.data(), val_size);
        assert((p + val_size) - buf == encoded_len);
        table_.Insert(buf);
    }